

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

Type __thiscall ON_SubDComponentPtr::ComponentType(ON_SubDComponentPtr *this)

{
  return (Type)(0x6020402020200 >> (sbyte)(((uint)this->m_ptr & 6) << 3));
}

Assistant:

ON_SubDComponentPtr::Type ON_SubDComponentPtr::ComponentType() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
    return ON_SubDComponentPtr::Type::Vertex;
  case ON_SUBD_COMPONENT_TYPE_EDGE:
    return ON_SubDComponentPtr::Type::Edge;
  case ON_SUBD_COMPONENT_TYPE_FACE:
    return ON_SubDComponentPtr::Type::Face;
  }
  return ON_SubDComponentPtr::Type::Unset;
}